

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_throw(CTcParser *this,int *err)

{
  int iVar1;
  CTcPrsNode *pCVar2;
  undefined4 *in_RSI;
  CTPNStmThrow *in_RDI;
  CTPNStmThrow *throw_stm;
  CTcPrsNode *expr;
  CTcTokenizer *in_stack_ffffffffffffffc8;
  CTPNStm *local_8;
  
  CTcTokenizer::next(in_stack_ffffffffffffffc8);
  pCVar2 = parse_expr((CTcParser *)0x269e91);
  if (pCVar2 == (CTcPrsNode *)0x0) {
    *in_RSI = 1;
    local_8 = (CTPNStm *)0x0;
  }
  else {
    local_8 = (CTPNStm *)CTcPrsAllocObj::operator_new(0x269ebe);
    CTPNStmThrow::CTPNStmThrow(in_RDI,(CTcPrsNode *)local_8);
    iVar1 = parse_req_sem();
    if (iVar1 != 0) {
      *in_RSI = 1;
      local_8 = (CTPNStm *)0x0;
    }
  }
  return local_8;
}

Assistant:

CTPNStm *CTcParser::parse_throw(int *err)
{
    CTcPrsNode *expr;
    CTPNStmThrow *throw_stm;
    
    /* skip the 'throw' keyword */
    G_tok->next();

    /* parse the expression to be thrown */
    expr = parse_expr();
    if (expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* create the statement node */
    throw_stm = new CTPNStmThrow(expr);

    /* require a terminating semicolon */
    if (parse_req_sem())
    {
        *err = TRUE;
        return 0;
    }

    /* return the statement node */
    return throw_stm;
}